

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput
          (ProStringList *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,
          ProStringList *l)

{
  int i;
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(l->super_QList<ProString>).d.size; uVar1 = uVar1 + 1) {
    ProString::toQString
              ((QString *)&local_98,
               (ProString *)((long)&(((l->super_QList<ProString>).d.ptr)->m_string).d.d + lVar2));
    fixForOutput((QString *)&local_80,this,(QString *)&local_98);
    ProString::ProString(&local_68,(QString *)&local_80);
    QList<ProString>::emplaceBack<ProString>
              (&__return_storage_ptr__->super_QList<ProString>,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    lVar2 = lVar2 + 0x30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const ProStringList &l)
{
    ProStringList ret;
    for(int i = 0; i < l.size(); i++)
        ret += fixForOutput(l[i].toQString());
    return ret;
}